

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode brotli_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  int iVar1;
  CURLcode CVar2;
  uint uVar3;
  size_t dstleft;
  uint8_t *dst;
  uint8_t *src;
  size_t local_50;
  long local_48;
  Curl_cwriter *local_40;
  char *local_38;
  
  local_50 = nbytes;
  local_38 = buf;
  if (((byte)type & nbytes != 0) == 0) {
    CVar2 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar2;
  }
  if (writer[0x201].cwt == (Curl_cwtype *)0x0) {
    CVar2 = CURLE_WRITE_ERROR;
  }
  else {
    while( true ) {
      local_48 = 0x4000;
      local_40 = writer + 1;
      iVar1 = BrotliDecoderDecompressStream
                        (writer[0x201].cwt,&local_50,&local_38,&local_48,&local_40,0);
      CVar2 = Curl_cwriter_write(data,writer->next,type,(char *)(writer + 1),0x4000 - local_48);
      if (CVar2 != CURLE_OK) break;
      CVar2 = CURLE_OK;
      if (1 < iVar1 - 2U) {
        if (iVar1 == 1) {
          BrotliDecoderDestroyInstance(writer[0x201].cwt);
          writer[0x201].cwt = (Curl_cwtype *)0x0;
          CVar2 = CURLE_WRITE_ERROR;
          if (local_50 == 0) {
            CVar2 = CURLE_OK;
          }
        }
        else {
          uVar3 = BrotliDecoderGetErrorCode(writer[0x201].cwt);
          CVar2 = CURLE_WRITE_ERROR;
          if (0xffffffe1 < uVar3) {
            CVar2 = *(CURLcode *)("identity" + (long)(int)uVar3 * 4);
          }
        }
      }
      if (iVar1 != 3 && local_50 == 0) {
        return CVar2;
      }
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode brotli_do_write(struct Curl_easy *data,
                                struct Curl_cwriter *writer, int type,
                                const char *buf, size_t nbytes)
{
  struct brotli_writer *bp = (struct brotli_writer *) writer;
  const uint8_t *src = (const uint8_t *) buf;
  uint8_t *dst;
  size_t dstleft;
  CURLcode result = CURLE_OK;
  BrotliDecoderResult r = BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT;

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  if(!bp->br)
    return CURLE_WRITE_ERROR;  /* Stream already ended. */

  while((nbytes || r == BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT) &&
        result == CURLE_OK) {
    dst = (uint8_t *) bp->buffer;
    dstleft = DECOMPRESS_BUFFER_SIZE;
    r = BrotliDecoderDecompressStream(bp->br,
                                      &nbytes, &src, &dstleft, &dst, NULL);
    result = Curl_cwriter_write(data, writer->next, type,
                                bp->buffer, DECOMPRESS_BUFFER_SIZE - dstleft);
    if(result)
      break;
    switch(r) {
    case BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT:
    case BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT:
      break;
    case BROTLI_DECODER_RESULT_SUCCESS:
      BrotliDecoderDestroyInstance(bp->br);
      bp->br = NULL;
      if(nbytes)
        result = CURLE_WRITE_ERROR;
      break;
    default:
      result = brotli_map_error(BrotliDecoderGetErrorCode(bp->br));
      break;
    }
  }
  return result;
}